

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
          (ImmutableExtensionLiteGenerator *this,FieldDescriptor *descriptor,Context *context)

{
  ClassNameResolver *pCVar1;
  Descriptor *pDVar2;
  string sStack_38;
  
  (this->super_ExtensionGenerator)._vptr_ExtensionGenerator =
       (_func_int **)&PTR__ImmutableExtensionLiteGenerator_0168f160;
  this->descriptor_ = descriptor;
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  (this->scope_)._M_dataplus._M_p = (pointer)&(this->scope_).field_2;
  (this->scope_)._M_string_length = 0;
  (this->scope_).field_2._M_local_buf[0] = '\0';
  this->context_ = context;
  pDVar2 = FieldDescriptor::extension_scope(this->descriptor_);
  if (pDVar2 == (Descriptor *)0x0) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (&sStack_38,this->name_resolver_,this->descriptor_->file_);
  }
  else {
    pCVar1 = this->name_resolver_;
    pDVar2 = FieldDescriptor::extension_scope(this->descriptor_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>(&sStack_38,pCVar1,pDVar2)
    ;
  }
  std::__cxx11::string::operator=((string *)&this->scope_,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator(
    const FieldDescriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      name_resolver_(context->GetNameResolver()),
      context_(context) {
  if (descriptor_->extension_scope() != nullptr) {
    scope_ =
        name_resolver_->GetImmutableClassName(descriptor_->extension_scope());
  } else {
    scope_ = name_resolver_->GetImmutableClassName(descriptor_->file());
  }
}